

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_BnB_Node.cpp
# Opt level: O0

string * __thiscall
BGIP_BnB_Node::SoftPrintPartiallySpecifiedPolicy_abi_cxx11_
          (BGIP_BnB_Node *this,BayesianGameIdenticalPayoffInterface *bgip,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jtIndexMapping)

{
  uint uVar1;
  Index IVar2;
  const_reference pvVar3;
  ostream *poVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  BayesianGameBase *in_RSI;
  string *in_RDI;
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes;
  Index jt;
  Index jt_oI;
  stringstream ss;
  ostream *in_stack_fffffffffffffdc8;
  BGIP_BnB_Node *in_stack_fffffffffffffdd0;
  uint local_1cc;
  uint local_1ac;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  
  local_20 = in_RCX;
  std::__cxx11::stringstream::stringstream(local_1a8);
  for (local_1ac = 0;
      local_1ac !=
      *(uint *)&(in_RSI->_m_jTypeProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage; local_1ac = local_1ac + 1) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_20,(ulong)local_1ac);
    uVar1 = *pvVar3;
    poVar4 = std::operator<<(local_198,"\tjt=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
    std::operator<<(poVar4," [");
    this_00 = BayesianGameBase::JointToIndividualTypeIndices(in_RSI,(Index)((ulong)in_RDI >> 0x20));
    local_1cc = 0;
    while( true ) {
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
      if (local_1cc == sVar5) break;
      poVar4 = std::operator<<(local_198," (");
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (this_00,(ulong)local_1cc);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
      poVar4 = std::operator<<(poVar4,"->");
      IVar2 = GetAction(in_stack_fffffffffffffdd0,(Index)((ulong)in_stack_fffffffffffffdc8 >> 0x20))
      ;
      in_stack_fffffffffffffdd0 = (BGIP_BnB_Node *)std::ostream::operator<<(poVar4,IVar2);
      std::operator<<((ostream *)in_stack_fffffffffffffdd0,")");
      local_1cc = local_1cc + 1;
    }
    in_stack_fffffffffffffdc8 = std::operator<<(local_198,"]");
    std::operator<<(in_stack_fffffffffffffdc8,"\n");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return in_RDI;
}

Assistant:

string BGIP_BnB_Node::SoftPrintPartiallySpecifiedPolicy(
    BayesianGameIdenticalPayoffInterface *bgip,
    const vector<Index> & jtIndexMapping

        ) const
{
    std::stringstream ss;
#if 1
    for(Index jt_oI=0;jt_oI!=_m_depth;++jt_oI)
    {
        Index jt;
#if DYNAMIC_JT_INDEX_MAPPING
        if(_m_jtIndexMapping)
            jt=(*_m_jtIndexMapping)[jt_oI];
        else
#endif
            jt=jtIndexMapping[jt_oI];
        ss << "\tjt=" << jt << " [";
        const std::vector<Index> &indTypes=
            bgip->JointToIndividualTypeIndices( jt );
        for(Index i=0;i!=indTypes.size();++i)
        {
            ss << " (" << indTypes[i] << "->"
               << GetAction(i) << ")";
        }
        ss << "]" << "\n";
    }
#else
    for(Index jt=0;jt!=_m_depth;++jt)
    {
        ss << "jt " << _m_jtIndexMapping[jt] << " [";
        const std::vector<Index> &indTypes=
            bgip->JointToIndividualTypeIndices(
                _m_jtIndexMapping[jt]);
        for(Index i=0;i!=indTypes.size();++i)
        {
            ss << " (" << indTypes[i] << "->"
               << GetAction(i) << ")";
        }
        ss << "]" << "\t";
    }
#endif
    return(ss.str());
}